

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

uint64_t __thiscall
Imf_3_3::Compressor::runEncodeStep
          (Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  exr_result_t eVar1;
  undefined8 uVar2;
  ArgExc *this_00;
  exr_encode_pipeline_t *in_RCX;
  int in_EDX;
  exr_context_t in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  exr_chunk_info_t cinfo;
  exr_encode_pipeline_t *in_stack_00000150;
  exr_chunk_info_t *in_stack_00000158;
  int in_stack_00000164;
  exr_const_context_t in_stack_00000168;
  char *in_stack_ffffffffffffff48;
  exr_encode_pipeline_t *in_stack_ffffffffffffff50;
  exr_chunk_info_t *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int part_index;
  exr_const_context_t in_stack_ffffffffffffff68;
  undefined1 local_70 [22];
  undefined1 local_5a;
  exr_chunk_info_t *in_stack_ffffffffffffffc8;
  uint64_t local_8;
  
  part_index = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  if (in_EDX == 0) {
    *in_R8 = in_RSI;
    local_8 = 0;
  }
  else {
    memset(local_70,0,0x40);
    Context::operator_cast_to__priv_exr_context_t_((Context *)0x17d38d);
    eVar1 = exr_chunk_default_initialize
                      (in_RSI,in_EDX,(exr_attr_box2i_t *)in_RCX,(int)((ulong)in_R8 >> 0x20),
                       (int)in_R8,in_stack_ffffffffffffffc8);
    if (eVar1 != 0) {
      uVar2 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    local_5a = (undefined1)*(undefined4 *)(in_RDI + 0x30);
    if ((*(byte *)(in_RDI + 0x431) & 1) == 0) {
      Context::operator_cast_to__priv_exr_context_t_((Context *)0x17d43a);
      eVar1 = exr_encoding_initialize
                        (in_stack_00000168,in_stack_00000164,in_stack_00000158,in_stack_00000150);
      if (eVar1 != 0) {
        uVar2 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      *(undefined1 *)(in_RDI + 0x431) = 1;
    }
    else {
      Context::operator_cast_to__priv_exr_context_t_((Context *)0x17d4d4);
      eVar1 = exr_encoding_update(in_stack_ffffffffffffff68,part_index,in_stack_ffffffffffffff58,
                                  in_stack_ffffffffffffff50);
      if (eVar1 != 0) {
        uVar2 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
    }
    *(exr_context_t *)(in_RDI + 0x298) = in_RSI;
    *(long *)(in_RDI + 0x2a0) = (long)in_EDX;
    eVar1 = exr_compress_chunk(in_RCX);
    if (eVar1 != 0) {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffff48);
      __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    *in_R8 = *(undefined8 *)(in_RDI + 0x2d8);
    *(undefined8 *)(in_RDI + 0x298) = 0;
    *(undefined8 *)(in_RDI + 0x2a0) = 0;
    local_8 = *(uint64_t *)(in_RDI + 0x2e0);
  }
  return local_8;
}

Assistant:

uint64_t
Compressor::runEncodeStep (
    const char* inPtr,
    int inSize,
    IMATH_NAMESPACE::Box2i range,
    const char*& outPtr)
{
    // special case
    if (inSize == 0)
    {
        outPtr = inPtr;
        return 0;
    }

    exr_chunk_info_t cinfo = {0};

    if (EXR_ERR_SUCCESS != exr_chunk_default_initialize (
            _ctxt, 0, (const exr_attr_box2i_t*) &range, _levelX, _levelY, &cinfo))
        throw IEX_NAMESPACE::ArgExc ("Unable to initialize chunk information");

    cinfo.type = _store_type;
    if (!_encoder_init)
    {
        if (EXR_ERR_SUCCESS != exr_encoding_initialize(_ctxt, 0, &cinfo, &_encoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to initialize encoder type");

        _encoder_init = true;
    }
    else
    {
        if (EXR_ERR_SUCCESS != exr_encoding_update(_ctxt, 0, &cinfo, &_encoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to update encoder type");
    }

    _encoder.packed_buffer = const_cast<char*> (inPtr);
    _encoder.packed_bytes = inSize;

    if (EXR_ERR_SUCCESS != exr_compress_chunk(&_encoder))
        throw IEX_NAMESPACE::ArgExc ("Unable to run compression routine");

    outPtr = (const char*) _encoder.compressed_buffer;

    _encoder.packed_buffer = nullptr;
    _encoder.packed_bytes = 0;

    return _encoder.compressed_bytes;
}